

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rle_decoder.cpp
# Opt level: O3

void __thiscall
duckdb::RLEDecoder::Read
          (RLEDecoder *this,uint8_t *defines,idx_t read_count,Vector *result,idx_t result_offset)

{
  ColumnReader *pCVar1;
  ResizeableBuffer *this_00;
  pointer this_01;
  idx_t new_size;
  idx_t iVar2;
  
  pCVar1 = this->reader;
  new_size = read_count;
  if (defines != (uint8_t *)0x0) {
    if (result_offset < result_offset + read_count) {
      iVar2 = 0;
      new_size = 0;
      do {
        new_size = new_size +
                   (pCVar1->column_schema->max_define == (ulong)defines[iVar2 + result_offset]);
        iVar2 = iVar2 + 1;
      } while (read_count != iVar2);
    }
    else {
      new_size = 0;
    }
  }
  this_00 = this->decoded_data_buffer;
  iVar2 = this_00->alloc_len;
  (this_00->super_ByteBuffer).ptr = (this_00->allocated_data).pointer;
  (this_00->super_ByteBuffer).len = iVar2;
  ResizeableBuffer::resize(this_00,pCVar1->reader->allocator,new_size);
  this_01 = unique_ptr<duckdb::RleBpDecoder,_std::default_delete<duckdb::RleBpDecoder>,_true>::
            operator->(&this->rle_decoder);
  RleBpDecoder::GetBatch<unsigned_char>
            (this_01,(this->decoded_data_buffer->super_ByteBuffer).ptr,(uint32_t)new_size);
  ColumnReader::PlainTemplated<bool,duckdb::TemplatedParquetValueConversion<bool>>
            (this->reader,&this->decoded_data_buffer->super_ByteBuffer,defines,read_count,
             result_offset,result);
  return;
}

Assistant:

void RLEDecoder::Read(uint8_t *defines, idx_t read_count, Vector &result, idx_t result_offset) {
	// RLE encoding for boolean
	D_ASSERT(reader.Type().id() == LogicalTypeId::BOOLEAN);
	idx_t valid_count = reader.GetValidCount(defines, read_count, result_offset);
	decoded_data_buffer.reset();
	decoded_data_buffer.resize(reader.reader.allocator, sizeof(bool) * valid_count);
	rle_decoder->GetBatch<uint8_t>(decoded_data_buffer.ptr, valid_count);
	reader.PlainTemplated<bool, TemplatedParquetValueConversion<bool>>(decoded_data_buffer, defines, read_count,
	                                                                   result_offset, result);
}